

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O3

DecimalQuantity * __thiscall
icu_63::number::impl::DecimalQuantity::setToDouble(DecimalQuantity *this,double n)

{
  byte bVar1;
  bool bVar2;
  
  setBcdToZero(this);
  this->flags = '\0';
  bVar2 = (long)n < 0;
  if (bVar2) {
    this->flags = '\x01';
    n = (double)((ulong)n ^ (ulong)DAT_002f1510);
  }
  if (NAN(n)) {
    bVar1 = bVar2 | 4;
  }
  else {
    if ((ulong)ABS(n) < 0x7ff0000000000000) {
      if ((n == 0.0) && (!NAN(n))) {
        return this;
      }
      _setToDoubleFast(this,n);
      compact(this);
      return this;
    }
    bVar1 = bVar2 | 2;
  }
  this->flags = bVar1;
  return this;
}

Assistant:

DecimalQuantity &DecimalQuantity::setToDouble(double n) {
    setBcdToZero();
    flags = 0;
    // signbit() from <math.h> handles +0.0 vs -0.0
    if (std::signbit(n)) {
        flags |= NEGATIVE_FLAG;
        n = -n;
    }
    if (std::isnan(n) != 0) {
        flags |= NAN_FLAG;
    } else if (std::isfinite(n) == 0) {
        flags |= INFINITY_FLAG;
    } else if (n != 0) {
        _setToDoubleFast(n);
        compact();
    }
    return *this;
}